

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.h
# Opt level: O1

optional<uuids::uuid> *
uuids::uuid::from_string<char[3]>(optional<uuids::uuid> *__return_storage_ptr__,char (*in_str) [3])

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  array<unsigned_char,_16UL> data;
  undefined8 local_28;
  undefined8 uStack_20;
  
  sVar2 = strlen(*in_str);
  local_28 = 0;
  uStack_20 = 0;
  if ((sVar2 != 0) && ((bVar9 = (*in_str)[0] == '{', !bVar9 || (in_str[-1][sVar2 + 2] == '}')))) {
    uVar3 = (ulong)bVar9;
    bVar8 = false;
    if (sVar2 - uVar3 <= uVar3) goto LAB_00174a58;
    bVar7 = true;
    lVar5 = 0;
    uVar4 = 0;
    do {
      bVar1 = (*in_str)[lVar5 + uVar3];
      if (bVar1 != 0x2d) {
        if (0xf < uVar4) goto LAB_00174a55;
        bVar6 = bVar1 - 0x30;
        if (9 < bVar6) {
          bVar8 = false;
          if ((0x25 < bVar1 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0))
          goto LAB_00174a58;
        }
        if (bVar7) {
          if (9 < bVar6) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar6 = bVar1 + 0xa9;
            }
            else {
              bVar6 = bVar1 - 0x37;
              if (5 < (byte)(bVar1 + 0xbf)) {
                bVar6 = 0;
              }
            }
          }
          *(byte *)((long)&local_28 + uVar4) = bVar6 << 4;
          bVar7 = false;
        }
        else {
          if (9 < bVar6) {
            if ((byte)(bVar1 + 0x9f) < 6) {
              bVar6 = bVar1 + 0xa9;
            }
            else {
              bVar6 = bVar1 - 0x37;
              if (5 < (byte)(bVar1 + 0xbf)) {
                bVar6 = 0;
              }
            }
          }
          *(byte *)((long)&local_28 + uVar4) = bVar6 | *(byte *)((long)&local_28 + uVar4);
          uVar4 = uVar4 + 1;
          bVar7 = true;
        }
      }
      lVar5 = lVar5 + 1;
    } while (sVar2 - (uint)bVar9 * 2 != lVar5);
    if (0xf < uVar4) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
        super__Optional_payload_base<uuids::uuid>._M_payload = local_28;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
               super__Optional_payload_base<uuids::uuid>._M_payload + 8) = uStack_20;
      bVar8 = true;
      goto LAB_00174a58;
    }
  }
LAB_00174a55:
  bVar8 = false;
LAB_00174a58:
  (__return_storage_ptr__->super__Optional_base<uuids::uuid,_true,_true>)._M_payload.
  super__Optional_payload_base<uuids::uuid>._M_engaged = bVar8;
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] constexpr static std::optional<uuid> from_string(StringType const & in_str) noexcept
      {
         auto str = detail::to_string_view(in_str);
         bool firstDigit = true;
         size_t hasBraces = 0;
         size_t index = 0;

         std::array<uint8_t, 16> data{ { 0 } };

         if (str.empty()) return {};

         if (str.front() == '{')
            hasBraces = 1;
         if (hasBraces && str.back() != '}')
            return {};

         for (size_t i = hasBraces; i < str.size() - hasBraces; ++i)
         {
            if (str[i] == '-') continue;

            if (index >= 16 || !detail::is_hex(str[i]))
            {
               return {};
            }

            if (firstDigit)
            {
               data[index] = static_cast<uint8_t>(detail::hex2char(str[i]) << 4);
               firstDigit = false;
            }
            else
            {
               data[index] = static_cast<uint8_t>(data[index] | detail::hex2char(str[i]));
               index++;
               firstDigit = true;
            }
         }

         if (index < 16)
         {
            return {};
         }

         return uuid{ data };
      }